

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSectionedSpine::~IfcSectionedSpine(IfcSectionedSpine *this)

{
  _func_int *p_Var1;
  
  p_Var1 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  *(undefined ***)
   ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var1) = &PTR__IfcSectionedSpine_00949bb0;
  *(undefined ***)(&this->field_0x68 + (long)p_Var1) = &PTR__IfcSectionedSpine_00949c28;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var1) = &PTR__IfcSectionedSpine_00949bd8;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var1) = &PTR__IfcSectionedSpine_00949c00;
  if (*(void **)(p_Var1 + (long)&(this->CrossSectionPositions).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
                                 ._M_impl.super__Vector_impl_data) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + (long)&(this->CrossSectionPositions).
                                               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
                                               .
                                               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
                                               ._M_impl.super__Vector_impl_data));
  }
  if (*(void **)(p_Var1 + (long)&(this->CrossSections).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                 ._M_impl.super__Vector_impl_data) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + (long)&(this->CrossSections).
                                               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                               .
                                               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                               ._M_impl.super__Vector_impl_data));
    return;
  }
  return;
}

Assistant:

IfcSectionedSpine() : Object("IfcSectionedSpine") {}